

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

BYTE HexToByte(char *hex)

{
  char cVar1;
  int i;
  long lVar2;
  BYTE BVar3;
  char cVar4;
  
  lVar2 = 0;
  BVar3 = '\0';
  do {
    cVar1 = hex[lVar2];
    if ((byte)(cVar1 - 0x30U) < 10) {
      BVar3 = cVar1 + BVar3 * '\x10' + 0xd0;
    }
    else {
      cVar4 = cVar1 + BVar3 * '\x10';
      if ((byte)(cVar1 + 0xbfU) < 6) {
        BVar3 = cVar4 + 0xbf;
      }
      else {
        BVar3 = cVar4 + 0x9f;
      }
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return BVar3;
}

Assistant:

static BYTE HexToByte (const char *hex)
{
	BYTE v = 0;
	for (int i = 0; i < 2; ++i)
	{
		v <<= 4;
		if (hex[i] >= '0' && hex[i] <= '9')
		{
			v += hex[i] - '0';
		}
		else if (hex[i] >= 'A' && hex[i] <= 'F')
		{
			v += hex[i] - 'A';
		}
		else // The string is already verified to contain valid hexits
		{
			v += hex[i] - 'a';
		}
	}
	return v;
}